

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O0

NetworkError statusCodeFromHttp(int httpStatusCode,QUrl *url)

{
  char *pcVar1;
  QString *this;
  uint in_EDI;
  long in_FS_OFFSET;
  NetworkError code;
  char *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff74;
  char *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  NetworkError local_6c;
  QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption> local_5c;
  QString local_58 [2];
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = (QString *)(ulong)(in_EDI - 400);
  if (in_EDI - 400 < 0x67 || in_EDI == 0x1f7) {
    switch((long)&switchD_0030f9f5::switchdataD_003d53c0 +
           (long)(int)(&switchD_0030f9f5::switchdataD_003d53c0)[(long)this]) {
    case 0x30f9f8:
      local_6c = ProtocolInvalidOperationError;
      break;
    case 0x30fa05:
      local_6c = AuthenticationRequiredError;
      break;
    case 0x30fa12:
      local_6c = ContentAccessDenied;
      break;
    case 0x30fa1f:
      local_6c = ContentNotFoundError;
      break;
    case 0x30fa2c:
      local_6c = ContentOperationNotPermittedError;
      break;
    case 0x30fa39:
      local_6c = ProxyAuthenticationRequiredError;
      break;
    case 0x30fa46:
      local_6c = ContentConflictError;
      break;
    case 0x30fa53:
      local_6c = ContentGoneError;
      break;
    case 0x30fa60:
      local_6c = ProtocolInvalidOperationError;
      break;
    case 0x30fa6d:
      local_6c = InternalServerError;
      break;
    case 0x30fa7a:
      local_6c = OperationNotImplementedError;
      break;
    case 0x30fa87:
      local_6c = ServiceUnavailableError;
      break;
    case 0x30fa94:
      goto switchD_0030f9f5_caseD_30fa94;
    }
  }
  else {
switchD_0030f9f5_caseD_30fa94:
    if ((int)in_EDI < 0x1f5) {
      if ((int)in_EDI < 400) {
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
        QUrlTwoFlags<QUrl::UrlFormattingOption,_QUrl::ComponentFormattingOption>::QUrlTwoFlags
                  (&local_5c,PrettyDecoded);
        QUrl::toString((QUrlTwoFlags_conflict1 *)local_58);
        QtPrivate::asString(local_58);
        QString::toLocal8Bit(this);
        pcVar1 = QByteArray::constData((QByteArray *)0x30fb27);
        QMessageLogger::warning
                  (local_28,
                   "QNetworkAccess: got HTTP status code %d which is not expected from url: \"%s\"",
                   (ulong)in_EDI,pcVar1);
        QByteArray::~QByteArray((QByteArray *)0x30fb4b);
        QString::~QString((QString *)0x30fb55);
        local_6c = ProtocolFailure;
      }
      else {
        local_6c = UnknownContentError;
      }
    }
    else {
      local_6c = UnknownServerError;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_6c;
}

Assistant:

static QNetworkReply::NetworkError statusCodeFromHttp(int httpStatusCode, const QUrl &url)
{
    QNetworkReply::NetworkError code;
    // we've got an error
    switch (httpStatusCode) {
    case 400:               // Bad Request
        code = QNetworkReply::ProtocolInvalidOperationError;
        break;

    case 401:               // Authorization required
        code = QNetworkReply::AuthenticationRequiredError;
        break;

    case 403:               // Access denied
        code = QNetworkReply::ContentAccessDenied;
        break;

    case 404:               // Not Found
        code = QNetworkReply::ContentNotFoundError;
        break;

    case 405:               // Method Not Allowed
        code = QNetworkReply::ContentOperationNotPermittedError;
        break;

    case 407:
        code = QNetworkReply::ProxyAuthenticationRequiredError;
        break;

    case 409:               // Resource Conflict
        code = QNetworkReply::ContentConflictError;
        break;

    case 410:               // Content no longer available
        code = QNetworkReply::ContentGoneError;
        break;

    case 418:               // I'm a teapot
        code = QNetworkReply::ProtocolInvalidOperationError;
        break;

    case 500:               // Internal Server Error
        code = QNetworkReply::InternalServerError;
        break;

    case 501:               // Server does not support this functionality
        code = QNetworkReply::OperationNotImplementedError;
        break;

    case 503:               // Service unavailable
        code = QNetworkReply::ServiceUnavailableError;
        break;

    default:
        if (httpStatusCode > 500) {
            // some kind of server error
            code = QNetworkReply::UnknownServerError;
        } else if (httpStatusCode >= 400) {
            // content error we did not handle above
            code = QNetworkReply::UnknownContentError;
        } else {
            qWarning("QNetworkAccess: got HTTP status code %d which is not expected from url: \"%s\"",
                     httpStatusCode, qPrintable(url.toString()));
            code = QNetworkReply::ProtocolFailure;
        }
    }

    return code;
}